

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::gray_convert(jpeg_decoder *this)

{
  int i;
  uint8 *s;
  uint8 *d;
  int row;
  jpeg_decoder *this_local;
  
  d = this->m_pScan_line_0;
  s = this->m_pSample_buf + (this->m_max_mcu_y_size - this->m_mcu_lines_left) * 8;
  for (i = this->m_max_mcus_per_row; 0 < i; i = i + -1) {
    *(undefined4 *)d = *(undefined4 *)s;
    *(undefined4 *)(d + 4) = *(undefined4 *)(s + 4);
    s = s + 0x40;
    d = d + 8;
  }
  return;
}

Assistant:

void jpeg_decoder::gray_convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d = m_pScan_line_0;
		uint8* s = m_pSample_buf + row * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			*(uint*)d = *(uint*)s;
			*(uint*)(&d[4]) = *(uint*)(&s[4]);

			s += 64;
			d += 8;
		}
	}